

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

bool __thiscall bench::push_back_model(bench *this,string_view name)

{
  bool bVar1;
  char *in_RCX;
  string_view name_00;
  optional<bench::model> mdl;
  undefined1 local_48 [40];
  bool local_20;
  
  name_00._M_len = name._M_str;
  name_00._M_str = in_RCX;
  model::make_model((optional<bench::model> *)local_48,(model *)name._M_len,name_00);
  bVar1 = local_20;
  if (local_20 == true) {
    std::vector<bench::model,std::allocator<bench::model>>::emplace_back<bench::model&>
              ((vector<bench::model,std::allocator<bench::model>> *)this,(model *)local_48);
  }
  if ((local_20 & 1U) != 0) {
    local_20 = false;
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
  }
  return bVar1;
}

Assistant:

bool push_back_model(std::string_view name)
    {
        auto mdl = model::make_model(name);

        if (!mdl)
            return false;

        models.emplace_back(*mdl);

        return true;
    }